

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# renderstyle.cpp
# Opt level: O0

double GetAlpha(int type,double alpha)

{
  double alpha_local;
  double dStack_10;
  int type_local;
  
  switch(type) {
  case 0:
    dStack_10 = 0.0;
    break;
  case 1:
    dStack_10 = 65536.0;
    break;
  case 2:
    dStack_10 = alpha;
    break;
  case 3:
    dStack_10 = 1.0 - alpha;
    break;
  default:
    dStack_10 = 0.0;
  }
  return dStack_10;
}

Assistant:

double GetAlpha(int type, double alpha)
{
	switch (type)
	{
	case STYLEALPHA_Zero:		return 0;
	case STYLEALPHA_One:		return OPAQUE;
	case STYLEALPHA_Src:		return alpha;
	case STYLEALPHA_InvSrc:		return 1. - alpha;
	default:					return 0;
	}
}